

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O2

int minimalSwap(word *pInOut,word *pMinimal,word *PDuplicat,int nVars,char *pCanonPerm,
               char *tempArray,uint *p_uCanonPhase)

{
  int iVar1;
  int iVar2;
  size_t __n;
  size_t __n_00;
  undefined4 local_5c;
  
  iVar1 = Kit_TruthWordNum_64bit(nVars);
  __n_00 = (size_t)nVars;
  local_5c = *p_uCanonPhase;
  __n = (size_t)(iVar1 << 3);
  memcpy(pMinimal,pInOut,__n);
  memcpy(PDuplicat,pInOut,__n);
  memcpy(tempArray,pCanonPerm,__n_00);
  Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,0);
  swapInfoAdjacentVars(0,pCanonPerm,p_uCanonPhase);
  iVar1 = 1;
  while( true ) {
    iVar2 = memCompare(pMinimal,pInOut,nVars);
    if (nVars + -1 <= iVar1) break;
    if (iVar2 == 1) {
      memcpy(pMinimal,pInOut,__n);
      memcpy(tempArray,pCanonPerm,__n_00);
      local_5c = *p_uCanonPhase;
    }
    else {
      memcpy(pInOut,pMinimal,__n);
      memcpy(pCanonPerm,tempArray,__n_00);
      *p_uCanonPhase = local_5c;
    }
    Kit_TruthSwapAdjacentVars_64bit(pInOut,nVars,iVar1);
    swapInfoAdjacentVars(iVar1,pCanonPerm,p_uCanonPhase);
    iVar1 = iVar1 + 1;
  }
  if (iVar2 == -1) {
    memcpy(pInOut,pMinimal,__n);
    memcpy(pCanonPerm,tempArray,__n_00);
    *p_uCanonPhase = local_5c;
  }
  iVar1 = bcmp(pInOut,PDuplicat,__n);
  return (int)(iVar1 != 0);
}

Assistant:

int minimalSwap(word* pInOut, word* pMinimal, word* PDuplicat, int  nVars, char * pCanonPerm, char * tempArray, unsigned* p_uCanonPhase) 
{
    int i;  
    int blockSizeWord = Kit_TruthWordNum_64bit( nVars )*sizeof(word);
    int blockSizeChar = nVars *sizeof(char);
    unsigned TempuCanonPhase = *p_uCanonPhase;
    memcpy(pMinimal, pInOut, (size_t)blockSizeWord);
    memcpy(PDuplicat, pInOut, (size_t)blockSizeWord);
    memcpy(tempArray, pCanonPerm, (size_t)blockSizeChar);  
    Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, 0 );
    swapInfoAdjacentVars(0, pCanonPerm, p_uCanonPhase);
    for(i=1;i<nVars-1;i++)
    {
        if( memCompare(pMinimal,pInOut,nVars) == 1)
        {
            memcpy(pMinimal, pInOut, (size_t)blockSizeWord);
            memcpy(tempArray, pCanonPerm, (size_t)blockSizeChar);
            TempuCanonPhase = *p_uCanonPhase;
            
        }
        else
        {
            memcpy(pInOut, pMinimal, (size_t)blockSizeWord);
            memcpy(pCanonPerm, tempArray, (size_t)blockSizeChar);
            *p_uCanonPhase = TempuCanonPhase;
        }
        Kit_TruthSwapAdjacentVars_64bit( pInOut, nVars, i );
        swapInfoAdjacentVars(i, pCanonPerm, p_uCanonPhase);
    }
    if( memCompare(pMinimal,pInOut,nVars) == -1)
    {
        memcpy(pInOut, pMinimal, (size_t)blockSizeWord);
        memcpy(pCanonPerm, tempArray, (size_t)blockSizeChar);
        *p_uCanonPhase = TempuCanonPhase;
    }
    if(memcmp(pInOut,PDuplicat,(size_t)blockSizeWord) == 0)
        return 0;
    else
        return 1;
}